

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall QVariantAnimation::setDuration(QVariantAnimation *this,int msecs)

{
  QVariantAnimationPrivate *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (msecs < 0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,"QVariantAnimation::setDuration: cannot set a negative duration");
  }
  else {
    this_00 = *(QVariantAnimationPrivate **)(this + 8);
    QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(&this_00->duration);
    if ((this_00->duration).super_QPropertyData<int>.val != msecs) {
      (this_00->duration).super_QPropertyData<int>.val = msecs;
      QVariantAnimationPrivate::recalculateCurrentInterval(this_00,false);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
        ::notify(&this_00->duration);
        return;
      }
      goto LAB_0036deb3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0036deb3:
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::setDuration(int msecs)
{
    Q_D(QVariantAnimation);
    if (msecs < 0) {
        qWarning("QVariantAnimation::setDuration: cannot set a negative duration");
        return;
    }
    d->duration.removeBindingUnlessInWrapper();
    if (d->duration.valueBypassingBindings() != msecs) {
        d->duration.setValueBypassingBindings(msecs);
        d->recalculateCurrentInterval();
        d->duration.notify();
    }
}